

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

Patient * __thiscall
Hospital::Entered_Patient
          (Hospital *this,string *username,string *password,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  pointer pPVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  string local_70;
  string local_50;
  
  pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_70,(Human *)((long)&(pPVar4->super_Human).Id._M_dataplus._M_p + lVar3));
      if (local_70._M_string_length == username->_M_string_length) {
        if (local_70._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_70._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                       local_70._M_string_length);
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((bVar6) &&
         (Human::Password_Getter_abi_cxx11_
                    (&local_50,
                     (Human *)((long)&(((All_Of_Patients->
                                        super__Vector_base<Patient,_std::allocator<Patient>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->super_Human).Id.
                                      _M_dataplus + lVar3)),
         local_50._M_string_length == password->_M_string_length)) {
        if (local_50._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar1 = bcmp(local_50._M_dataplus._M_p,(password->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar7 = iVar1 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) goto LAB_0011fc7a;
      uVar5 = uVar5 + 1;
      pPVar4 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 4) *
              -0x30c30c30c30c30c3;
      lVar3 = lVar3 + 0x150;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  uVar5 = 0;
LAB_0011fc7a:
  return (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
         super__Vector_impl_data._M_start + uVar5;
}

Assistant:

Patient* Hospital :: Entered_Patient(string username , string password , vector<Patient>All_Of_Patients){
    int g =0;
    for (int i = 0; i < All_Of_Patients.size(); ++i) {
        if (All_Of_Patients[i].User_name_Getter() == username && All_Of_Patients[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }

    return &All_Of_Patients[g];
}